

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall Highs::getBasicVariablesInterface(Highs *this,HighsInt *basic_variables)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  HighsStatus HVar5;
  ulong uVar6;
  uint uVar7;
  HighsLpSolverObject solver_object;
  string local_f8;
  HighsLogOptions local_d8;
  HighsLpSolverObject local_78;
  
  uVar1 = (this->model_).lp_.num_row_;
  if ((ulong)uVar1 == 0) {
    HVar5 = kOk;
  }
  else if ((this->basis_).valid == false) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getBasicVariables called without a HiGHS basis\n");
    HVar5 = kError;
  }
  else {
    iVar2 = (this->model_).lp_.num_col_;
    HVar5 = kOk;
    if ((this->ekk_instance_).status_.has_invert == false) {
      local_78.lp_ = &(this->model_).lp_;
      local_78.ekk_instance_ = &this->ekk_instance_;
      local_78.basis_ = &this->basis_;
      local_78.solution_ = &this->solution_;
      local_78.highs_info_ = &this->info_;
      local_78.callback_ = &this->callback_;
      local_78.options_ = &this->options_;
      local_78.timer_ = &this->timer_;
      local_78.model_status_ = kMin;
      local_d8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_d8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_d8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_d8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_d8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_d8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(&local_d8.user_callback,
                 &(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_d8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_d8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      HVar5 = formSimplexLpBasisAndFactor(&local_78,true);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"formSimplexLpBasisAndFactor","");
      HVar5 = interpretCallStatus(&local_d8,HVar5,kOk,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_d8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_d8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)&local_d8.user_callback,(_Any_data *)&local_d8.user_callback,
                   __destroy_functor);
      }
      if (HVar5 != kOk) {
        return HVar5;
      }
    }
    if (0 < (int)uVar1) {
      piVar4 = (this->ekk_instance_).basis_.basicIndex_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = 0;
      do {
        uVar3 = piVar4[uVar6];
        uVar7 = ~uVar3 + iVar2;
        if ((int)uVar3 < iVar2) {
          uVar7 = uVar3;
        }
        basic_variables[uVar6] = uVar7;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  return HVar5;
}

Assistant:

HighsStatus Highs::getBasicVariablesInterface(HighsInt* basic_variables) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_col = lp.num_col_;
  HighsSimplexStatus& ekk_status = ekk_instance_.status_;
  // For an LP with no rows the solution is vacuous
  if (num_row == 0) return return_status;
  if (!basis_.valid) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasicVariables called without a HiGHS basis\n");
    return HighsStatus::kError;
  }
  if (!ekk_status.has_invert) {
    // The LP has no invert to use, so have to set one up, but only
    // for the current basis, so return_value is the rank deficiency.
    HighsLpSolverObject solver_object(lp, basis_, solution_, info_,
                                      ekk_instance_, callback_, options_,
                                      timer_);
    const bool only_from_known_basis = true;
    return_status = interpretCallStatus(
        options_.log_options,
        formSimplexLpBasisAndFactor(solver_object, only_from_known_basis),
        return_status, "formSimplexLpBasisAndFactor");
    if (return_status != HighsStatus::kOk) return return_status;
  }
  assert(ekk_status.has_invert);

  for (HighsInt row = 0; row < num_row; row++) {
    HighsInt var = ekk_instance_.basis_.basicIndex_[row];
    if (var < num_col) {
      basic_variables[row] = var;
    } else {
      basic_variables[row] = -(1 + var - num_col);
    }
  }
  return return_status;
}